

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::scaleRow(Highs *this,HighsInt row,double scale_value)

{
  HighsStatus HVar1;
  allocator local_99;
  double local_98;
  string local_90;
  HighsLogOptions local_70;
  
  local_98 = scale_value;
  clearDerivedModelProperties(this);
  HVar1 = scaleRowInterface(this,row,local_98);
  HighsLogOptions::HighsLogOptions(&local_70,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  std::__cxx11::string::string((string *)&local_90,"scaleRow",&local_99);
  HVar1 = interpretCallStatus(&local_70,HVar1,kOk,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::_Function_base::~_Function_base(&local_70.user_callback.super__Function_base);
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(this,HVar1);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::scaleRow(const HighsInt row, const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsStatus call_status = scaleRowInterface(row, scale_value);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "scaleRow");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}